

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::setStartingLocationOfPlayers(Game *this)

{
  bool bVar1;
  reference ppPVar2;
  ostream *poVar3;
  string *psVar4;
  int local_38;
  byte local_31;
  int selection;
  bool selected;
  Player *player;
  iterator __end1;
  iterator __begin1;
  vector<Player_*,_std::allocator<Player_*>_> *__range1;
  Game *this_local;
  
  __end1 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(&players);
  player = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(&players);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                     *)&player), bVar1) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
              operator*(&__end1);
    _selection = *ppPVar2;
    local_31 = 1;
    while ((local_31 & 1) != 0) {
      local_38 = -1;
      poVar3 = std::operator<<((ostream *)&std::cout,"Which region do you want to start at : ");
      psVar4 = Player::getPlayerName_abi_cxx11_(_selection);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"?");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Map::showMapWithOwners(this->newYork);
      std::istream::operator>>((istream *)&std::cin,&local_38);
      if (local_38 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"You cannot start in Manhattan! ");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else if ((local_38 < 1) || (6 < local_38)) {
        if (local_38 < 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Must select number between 0-10 !");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else {
          bVar1 = Map::isRegionFull(this->newYork,local_38);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "The location you selected is full : Has 2 players in it already "
                                    );
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          }
          else {
            Map::setRegionOwner(this->newYork,local_38,_selection);
            local_31 = 0;
          }
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"You cannot start in a Manhattan subregion! "
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Game::setStartingLocationOfPlayers() {

    for (auto player : players) {

        bool selected = true;
        while(selected){
            int selection= -1;
            cout << "Which region do you want to start at : " << player->getPlayerName() << "?" << endl;
            newYork->showMapWithOwners();
            cin >> selection;

            if(selection == 0){  // Manhattan
                cout << "You cannot start in Manhattan! " << endl;
            }
            else if (selection> 0 && selection<7){ // Manhattan subregions
                cout << "You cannot start in a Manhattan subregion! " << endl;
            }
            else if (selection < 0){ // Manhattan subregions
                cout << "Must select number between 0-10 !" << endl;
            }
            else {
                if(newYork->isRegionFull(selection)) {
                    cout << "The location you selected is full : Has 2 players in it already " << endl;
                }
                else {
                    newYork->setRegionOwner(selection, player);
                    selected = false;

                }

            }

        }
        continue;

   }

}